

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClearIniSettings(void)

{
  ImGuiContext *pIVar1;
  ImVector<ImGuiSettingsHandler> *this;
  ImGuiSettingsHandler *pIVar2;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *__end1;
  ImGuiSettingsHandler *__begin1;
  ImVector<ImGuiSettingsHandler> *__range1;
  ImGuiContext *g;
  ImGuiSettingsHandler *local_18;
  
  pIVar1 = GImGui;
  ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x201ae1);
  this = &pIVar1->SettingsHandlers;
  local_18 = ImVector<ImGuiSettingsHandler>::begin(this);
  pIVar2 = ImVector<ImGuiSettingsHandler>::end(this);
  for (; local_18 != pIVar2; local_18 = local_18 + 1) {
    if (local_18->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      (*local_18->ClearAllFn)(pIVar1,local_18);
    }
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ClearAllFn != NULL)
            handler.ClearAllFn(&g, &handler);
}